

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O1

ICameraSceneNode * __thiscall
irr::scene::CSceneManager::addCameraSceneNode
          (CSceneManager *this,ISceneNode *parent,vector3df *position,vector3df *lookat,s32 id,
          bool makeActive)

{
  code *pcVar1;
  _func_int *p_Var2;
  CCameraSceneNode *this_00;
  undefined7 in_register_00000089;
  
  if (parent == (ISceneNode *)0x0) {
    parent = (ISceneNode *)&(this->super_ISceneManager).field_0x8;
  }
  this_00 = (CCameraSceneNode *)operator_new(0x2a0);
  CCameraSceneNode::CCameraSceneNode(this_00,parent,&this->super_ISceneManager,id,position,lookat);
  if ((int)CONCAT71(in_register_00000089,makeActive) != 0) {
    (*(this->super_ISceneManager)._vptr_ISceneManager[0xf])(this,this_00);
  }
  p_Var2 = (this_00->super_ICameraSceneNode).super_ISceneNode._vptr_ISceneNode[-3];
  pcVar1 = p_Var2 + -0x20 +
           (long)(this_00->super_ICameraSceneNode).super_ISceneNode.AbsoluteTransformation.M;
  *(int *)pcVar1 = *(int *)pcVar1 + -1;
  if (*(int *)pcVar1 == 0) {
    (**(code **)(*(long *)(p_Var2 + -0x30 +
                          (long)(this_00->super_ICameraSceneNode).super_ISceneNode.
                                AbsoluteTransformation.M) + 8))();
  }
  return &this_00->super_ICameraSceneNode;
}

Assistant:

ICameraSceneNode *CSceneManager::addCameraSceneNode(ISceneNode *parent,
		const core::vector3df &position, const core::vector3df &lookat, s32 id,
		bool makeActive)
{
	if (!parent)
		parent = this;

	ICameraSceneNode *node = new CCameraSceneNode(parent, this, id, position, lookat);

	if (makeActive)
		setActiveCamera(node);
	node->drop();

	return node;
}